

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.c
# Opt level: O0

_Bool similar_signatures(char *sig1,char *sig2)

{
  int iVar1;
  int iVar2;
  int q2;
  int q1;
  int i;
  int correct;
  int local_20;
  int local_1c;
  
  local_1c = 0;
  local_20 = 0;
  while( true ) {
    if (0x50 < local_20) {
      return 0.95 < (float)local_1c / 81.0;
    }
    iVar1 = base64_decode('\0');
    iVar2 = base64_decode('\0');
    iVar1 = iVar1 - iVar2;
    if (iVar1 < 1) {
      iVar1 = -iVar1;
    }
    if (1 < iVar1) break;
    local_1c = local_1c + 1;
    local_20 = local_20 + 1;
  }
  return false;
}

Assistant:

static bool similar_signatures(char const sig1[SIG_LEN], char const sig2[SIG_LEN])
{
   int correct = 0;
   int i;

   for (i = 0; i < SIG_LEN; i++) {
      int q1 = base64_decode(sig1[i]);
      int q2 = base64_decode(sig2[i]);

      /* A difference of one quantisation level could be because two values
       * which were originally close by straddled a quantisation boundary.
       * A difference of two quantisation levels is a significant deviation.
       */
      if (abs(q1 - q2) > 1)
         return false;

      correct++;
   }

   return ((float)correct / SIG_LEN) > 0.95;
}